

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_misc(void)

{
  ulong local_10;
  size_t i;
  
  wr_u32b(seed_randart);
  wr_u32b(seed_flavor);
  wr_u16b(player->total_winner);
  wr_u16b(player->noscore);
  wr_byte(player->is_dead & 1);
  wr_s32b(turn);
  for (local_10 = 0; local_10 < 5; local_10 = local_10 + 1) {
    wr_byte(player->obj_k->flags[local_10]);
  }
  for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
    wr_s16b(player->obj_k->modifiers[local_10]);
  }
  for (local_10 = 0; local_10 < 0x19; local_10 = local_10 + 1) {
    wr_s16b(player->obj_k->el_info[local_10].res_level);
    wr_byte(player->obj_k->el_info[local_10].flags);
  }
  for (local_10 = 0; local_10 < z_info->brand_max; local_10 = local_10 + 1) {
    wr_byte((player->obj_k->brands[local_10] & 1U) != 0);
  }
  for (local_10 = 0; local_10 < z_info->slay_max; local_10 = local_10 + 1) {
    wr_byte((player->obj_k->slays[local_10] & 1U) != 0);
  }
  for (local_10 = 0; local_10 < z_info->curse_max; local_10 = local_10 + 1) {
    wr_byte(player->obj_k->curses[local_10].power != L'\0');
  }
  wr_s16b(player->obj_k->ac);
  wr_s16b(player->obj_k->to_a);
  wr_s16b(player->obj_k->to_h);
  wr_s16b(player->obj_k->to_d);
  wr_byte(player->obj_k->dd);
  wr_byte(player->obj_k->ds);
  return;
}

Assistant:

void wr_misc(void)
{
	size_t i;

	/* Random artifact seed */
	wr_u32b(seed_randart);

	/* Write the "object seeds" */
	wr_u32b(seed_flavor);

	/* Special stuff */
	wr_u16b(player->total_winner);
	wr_u16b(player->noscore);

	/* Write death */
	wr_byte(player->is_dead);

	/* Current turn */
	wr_s32b(turn);

	/* Property knowledge */
	//if (player->is_dead)
	//	return;

	/* Flags */
	for (i = 0; i < OF_SIZE; i++)
		wr_byte(player->obj_k->flags[i]);

	/* Modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		wr_s16b(player->obj_k->modifiers[i]);
	}

	/* Elements */
	for (i = 0; i < ELEM_MAX; i++) {
		wr_s16b(player->obj_k->el_info[i].res_level);
		wr_byte(player->obj_k->el_info[i].flags);
	}

	/* Brands */
	for (i = 0; i < z_info->brand_max; i++) {
		wr_byte(player->obj_k->brands[i] ? 1 : 0);
	}

	/* Slays */
	for (i = 0; i < z_info->slay_max; i++) {
		wr_byte(player->obj_k->slays[i] ? 1 : 0);
	}

	/* Curses */
	for (i = 0; i < z_info->curse_max; i++) {
		wr_byte(player->obj_k->curses[i].power ? 1 : 0);
	}

	/* Combat data */
	wr_s16b(player->obj_k->ac);
	wr_s16b(player->obj_k->to_a);
	wr_s16b(player->obj_k->to_h);
	wr_s16b(player->obj_k->to_d);
	wr_byte(player->obj_k->dd);
	wr_byte(player->obj_k->ds);
}